

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_overwrite(EditLine *el,wchar_t *cp,size_t n)

{
  wchar_t wVar1;
  wchar_t wVar2;
  undefined8 in_RAX;
  wchar_t wVar3;
  wint_t *pwVar4;
  size_t sVar5;
  wchar_t c;
  undefined8 uStack_28;
  
  if ((n != 0) && (n <= (ulong)(long)(el->el_terminal).t_size.h)) {
    sVar5 = 0;
    uStack_28 = in_RAX;
    do {
      terminal__putc(el,cp[sVar5]);
      wVar2 = (el->el_cursor).h + L'\x01';
      (el->el_cursor).h = wVar2;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
    wVar1 = (el->el_terminal).t_size.h;
    if (wVar1 <= wVar2) {
      wVar2 = (el->el_terminal).t_flags;
      if ((char)wVar2 < '\0') {
        (el->el_cursor).h = L'\0';
        wVar3 = (el->el_cursor).v;
        wVar1 = wVar3 + L'\x01';
        if (wVar1 < (el->el_terminal).t_size.v) {
          (el->el_cursor).v = wVar1;
          wVar3 = wVar1;
        }
        if (((uint)wVar2 >> 8 & 1) != 0) {
          uStack_28 = CONCAT44(*el->el_display[wVar3],(undefined4)uStack_28);
          if (*el->el_display[wVar3] == 0) {
            terminal__putc(el,0x20);
            (el->el_cursor).h = L'\x01';
          }
          else {
            terminal_overwrite(el,(wchar_t *)((long)&uStack_28 + 4),1);
            wVar2 = (el->el_cursor).h;
            if (el->el_display[(el->el_cursor).v][wVar2] == 0xffffffff) {
              pwVar4 = el->el_display[(el->el_cursor).v] + wVar2;
              do {
                wVar2 = wVar2 + L'\x01';
                pwVar4 = pwVar4 + 1;
                (el->el_cursor).h = wVar2;
              } while (*pwVar4 == 0xffffffff);
            }
          }
        }
      }
      else {
        (el->el_cursor).h = wVar1 + L'\xffffffff';
      }
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_overwrite(EditLine *el, const wchar_t *cp, size_t n)
{
	if (n == 0)
		return;

	if (n > (size_t)el->el_terminal.t_size.h) {
#ifdef DEBUG_SCREEN
		(void) fprintf(el->el_errfile,
		    "%s: n is ridiculous: %zu\r\n", __func__, n);
#endif /* DEBUG_SCREEN */
		return;
	}

        do {
                /* terminal__putc() ignores any MB_FILL_CHARs */
                terminal__putc(el, *cp++);
                el->el_cursor.h++;
        } while (--n);

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {	/* wrap? */
		if (EL_HAS_AUTO_MARGINS) {	/* yes */
			el->el_cursor.h = 0;
			if (el->el_cursor.v + 1 < el->el_terminal.t_size.v)
				el->el_cursor.v++;
			if (EL_HAS_MAGIC_MARGINS) {
				/* force the wrap to avoid the "magic"
				 * situation */
				wchar_t c;
				if ((c = el->el_display[el->el_cursor.v]
				    [el->el_cursor.h]) != '\0') {
					terminal_overwrite(el, &c, (size_t)1);
					while (el->el_display[el->el_cursor.v]
					    [el->el_cursor.h] == MB_FILL_CHAR)
						el->el_cursor.h++;
				} else {
					terminal__putc(el, ' ');
					el->el_cursor.h = 1;
				}
			}
		} else		/* no wrap, but cursor stays on screen */
			el->el_cursor.h = el->el_terminal.t_size.h - 1;
	}
}